

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::to_stream(Tree *this,size_t node,type_bits more_flags)

{
  code *pcVar1;
  size_t c;
  size_t l;
  bool bVar2;
  error_flags eVar3;
  long in_RDI;
  char msg [37];
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  Location *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined1 local_48 [72];
  
  bVar2 = has_children((Tree *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (bVar2) {
    memcpy(local_48,"check failed: (! has_children(node))",0x25);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    l = CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    c = CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff98;
    in_stack_ffffffffffffff54 = in_stack_ffffffffffffff9c;
    in_stack_ffffffffffffff58 = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff5c = in_stack_ffffffffffffffa4;
    Location::Location(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),l,c);
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff50;
    in_stack_ffffffffffffff9c = in_stack_ffffffffffffff54;
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff58;
    in_stack_ffffffffffffffa4 = in_stack_ffffffffffffff5c;
    (*pcVar1)(local_48,0x25,*(undefined8 *)(in_RDI + 0x40));
    in_stack_ffffffffffffff60 = uStack_58;
    in_stack_ffffffffffffff64 = uStack_54;
  }
  _set_flags((Tree *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  _p((Tree *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  NodeScalar::clear((NodeScalar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  _p((Tree *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  NodeScalar::clear((NodeScalar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void Tree::to_stream(size_t node, type_bits more_flags)
{
    _RYML_CB_ASSERT(m_callbacks,  ! has_children(node));
    _set_flags(node, STREAM|more_flags);
    _p(node)->m_key.clear();
    _p(node)->m_val.clear();
}